

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenerators::Run(cmQtAutoGenerators *this,string *targetDirectory,string *config)

{
  Snapshot snapshot;
  bool bVar1;
  int iVar2;
  cmLocalGenerator *pcVar3;
  cmake cm;
  cmGlobalGenerator gg;
  Snapshot local_868;
  cmake local_850;
  cmGlobalGenerator local_5f0;
  
  cmake::cmake(&local_850);
  cmake::SetHomeOutputDirectory(&local_850,targetDirectory);
  cmake::SetHomeDirectory(&local_850,targetDirectory);
  cmGlobalGenerator::cmGlobalGenerator(&local_5f0,&local_850);
  cmState::Snapshot::Snapshot(&local_868,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_868.Position.Tree;
  snapshot.State = local_868.State;
  snapshot.Position.Position = local_868.Position.Position;
  pcVar3 = cmGlobalGenerator::MakeLocalGenerator(&local_5f0,snapshot,(cmLocalGenerator *)0x0);
  cmMakefile::SetCurrentBinaryDirectory(pcVar3->Makefile,targetDirectory);
  cmMakefile::SetCurrentSourceDirectory(pcVar3->Makefile,targetDirectory);
  local_5f0.CurrentMakefile = pcVar3->Makefile;
  ReadAutogenInfoFile(this,local_5f0.CurrentMakefile,targetDirectory,config);
  ReadOldMocDefinitionsFile(this,pcVar3->Makefile,targetDirectory);
  Init(this);
  iVar2 = std::__cxx11::string::compare((char *)this);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)this);
    bVar1 = true;
    if (iVar2 != 0) goto LAB_00398cf6;
  }
  bVar1 = RunAutogen(this,pcVar3->Makefile);
LAB_00398cf6:
  WriteOldMocDefinitionsFile(this,targetDirectory);
  (*pcVar3->_vptr_cmLocalGenerator[1])(pcVar3);
  cmGlobalGenerator::~cmGlobalGenerator(&local_5f0);
  cmake::~cmake(&local_850);
  return bVar1;
}

Assistant:

bool cmQtAutoGenerators::Run(const std::string& targetDirectory,
                             const std::string& config)
{
  bool success = true;
  cmake cm;
  cm.SetHomeOutputDirectory(targetDirectory);
  cm.SetHomeDirectory(targetDirectory);
  cmGlobalGenerator gg(&cm);

  cmLocalGenerator* lg = gg.MakeLocalGenerator();
  lg->GetMakefile()->SetCurrentBinaryDirectory(targetDirectory);
  lg->GetMakefile()->SetCurrentSourceDirectory(targetDirectory);
  gg.SetCurrentMakefile(lg->GetMakefile());

  this->ReadAutogenInfoFile(lg->GetMakefile(), targetDirectory, config);
  this->ReadOldMocDefinitionsFile(lg->GetMakefile(), targetDirectory);

  this->Init();

  if (this->QtMajorVersion == "4" || this->QtMajorVersion == "5")
    {
    success = this->RunAutogen(lg->GetMakefile());
    }

  this->WriteOldMocDefinitionsFile(targetDirectory);

  delete lg;
  return success;
}